

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

uint __thiscall leveldb::log::Reader::ReadPhysicalRecord(Reader *this,Slice *result)

{
  uint64_t uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t masked_crc;
  size_t sVar4;
  Slice *this_00;
  Slice local_78;
  uint64_t local_68;
  size_t drop_size_1;
  uint32_t actual_crc;
  uint32_t expected_crc;
  size_t drop_size;
  uint32_t length;
  uint type;
  uint32_t b;
  uint32_t a;
  char *header;
  Status local_28;
  Status status;
  Slice *result_local;
  Reader *this_local;
  
  status.state_ = (char *)result;
  while (sVar4 = Slice::size(&this->buffer_), sVar4 < 7) {
    if ((this->eof_ & 1U) != 0) {
      Slice::clear(&this->buffer_);
      return 5;
    }
    this_00 = &this->buffer_;
    Slice::clear(this_00);
    (*this->file_->_vptr_SequentialFile[2])
              (&local_28,this->file_,0x8000,this_00,this->backing_store_);
    sVar4 = Slice::size(this_00);
    this->end_of_buffer_offset_ = this->end_of_buffer_offset_ + sVar4;
    bVar2 = Status::ok(&local_28);
    if (bVar2) {
      sVar4 = Slice::size(&this->buffer_);
      if (sVar4 < 0x8000) {
        this->eof_ = true;
      }
      header._0_4_ = 2;
    }
    else {
      Slice::clear(&this->buffer_);
      ReportDrop(this,0x8000,&local_28);
      this->eof_ = true;
      this_local._4_4_ = 5;
      header._0_4_ = 1;
    }
    Status::~Status(&local_28);
    if ((int)header == 1) {
      return this_local._4_4_;
    }
  }
  _b = Slice::data(&this->buffer_);
  type = (uint)(byte)*(ushort *)(_b + 4);
  length = (uint32_t)(byte)_b[5];
  drop_size._4_4_ = (uint)_b[6];
  drop_size._0_4_ = (uint)*(ushort *)(_b + 4);
  uVar3 = (uint)drop_size + 7;
  sVar4 = Slice::size(&this->buffer_);
  if (sVar4 < uVar3) {
    _actual_crc = Slice::size(&this->buffer_);
    Slice::clear(&this->buffer_);
    if ((this->eof_ & 1U) == 0) {
      ReportCorruption(this,_actual_crc,"bad record length");
      return 6;
    }
    return 5;
  }
  if ((drop_size._4_4_ == 0) && ((uint)drop_size == 0)) {
    Slice::clear(&this->buffer_);
    return 6;
  }
  if ((this->checksum_ & 1U) != 0) {
    masked_crc = DecodeFixed32(_b);
    drop_size_1._4_4_ = crc32c::Unmask(masked_crc);
    drop_size_1._0_4_ = crc32c::Value(_b + 6,(ulong)((uint)drop_size + 1));
    if ((uint32_t)drop_size_1 != drop_size_1._4_4_) {
      local_68 = Slice::size(&this->buffer_);
      Slice::clear(&this->buffer_);
      ReportCorruption(this,local_68,"checksum mismatch");
      return 6;
    }
  }
  Slice::remove_prefix(&this->buffer_,(ulong)((uint)drop_size + 7));
  uVar1 = this->end_of_buffer_offset_;
  sVar4 = Slice::size(&this->buffer_);
  if (((uVar1 - sVar4) + -7) - (ulong)(uint)drop_size < this->initial_offset_) {
    Slice::clear((Slice *)status.state_);
    return 6;
  }
  Slice::Slice(&local_78,_b + 7,(ulong)(uint)drop_size);
  *(char **)status.state_ = local_78.data_;
  *(size_t *)(status.state_ + 8) = local_78.size_;
  return drop_size._4_4_;
}

Assistant:

unsigned int Reader::ReadPhysicalRecord(Slice *result) {
            while (true) {
                if (buffer_.size() < kHeaderSize) {
                    if (!eof_) {
                        // Last read was a full read, so this is a trailer to skip
                        buffer_.clear();
                        Status status = file_->Read(kBlockSize, &buffer_, backing_store_);
                        end_of_buffer_offset_ += buffer_.size();
                        if (!status.ok()) {
                            buffer_.clear();
                            ReportDrop(kBlockSize, status);
                            eof_ = true;
                            return kEof;
                        } else if (buffer_.size() < kBlockSize) {
                            eof_ = true;
                        }
                        continue;
                    } else {
                        // Note that if buffer_ is non-empty, we have a truncated header at the
                        // end of the file, which can be caused by the writer crashing in the
                        // middle of writing the header. Instead of considering this an error,
                        // just report EOF.
                        buffer_.clear();
                        return kEof;
                    }
                }

                // Parse the header
                const char *header = buffer_.data();
                const uint32_t a = static_cast<uint32_t>(header[4]) & 0xff;
                const uint32_t b = static_cast<uint32_t>(header[5]) & 0xff;
                const unsigned int type = header[6];
                const uint32_t length = a | (b << 8);
                if (kHeaderSize + length > buffer_.size()) {
                    size_t drop_size = buffer_.size();
                    buffer_.clear();
                    if (!eof_) {
                        ReportCorruption(drop_size, "bad record length");
                        return kBadRecord;
                    }
                    // If the end of the file has been reached without reading |length| bytes
                    // of payload, assume the writer died in the middle of writing the record.
                    // Don't report a corruption.
                    return kEof;
                }

                if (type == kZeroType && length == 0) {
                    // Skip zero length record without reporting any drops since
                    // such records are produced by the mmap based writing code in
                    // env_posix.cc that preallocates file regions.
                    buffer_.clear();
                    return kBadRecord;
                }

                // Check crc
                if (checksum_) {
                    uint32_t expected_crc = crc32c::Unmask(DecodeFixed32(header));
                    uint32_t actual_crc = crc32c::Value(header + 6, 1 + length);
                    if (actual_crc != expected_crc) {
                        // Drop the rest of the buffer since "length" itself may have
                        // been corrupted and if we trust it, we could find some
                        // fragment of a real log record that just happens to look
                        // like a valid log record.
                        size_t drop_size = buffer_.size();
                        buffer_.clear();
                        ReportCorruption(drop_size, "checksum mismatch");
                        return kBadRecord;
                    }
                }

                buffer_.remove_prefix(kHeaderSize + length);

                // Skip physical record that started before initial_offset_
                if (end_of_buffer_offset_ - buffer_.size() - kHeaderSize - length <
                    initial_offset_) {
                    result->clear();
                    return kBadRecord;
                }

                *result = Slice(header + kHeaderSize, length);
                return type;
            }
        }